

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O3

Vector<double,_2> tcu::reflect<double,2>(Vector<double,_2> *i,Vector<double,_2> *n)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  Vector<double,_2> *res_1;
  bool bVar4;
  double *in_RDI;
  long lVar5;
  double res;
  double dVar6;
  Vector<double,_2> VVar7;
  
  dVar6 = 0.0;
  lVar5 = 0;
  bVar3 = true;
  do {
    bVar4 = bVar3;
    dVar6 = dVar6 + n->m_data[lVar5] * i->m_data[lVar5];
    lVar5 = 1;
    bVar3 = false;
  } while (bVar4);
  dVar1 = n->m_data[1];
  VVar7.m_data[0] = (dVar6 + dVar6) * n->m_data[0];
  dVar2 = i->m_data[1];
  VVar7.m_data[1] = i->m_data[0] - VVar7.m_data[0];
  *in_RDI = VVar7.m_data[1];
  in_RDI[1] = dVar2 - (dVar6 + dVar6) * dVar1;
  return (Vector<double,_2>)VVar7.m_data;
}

Assistant:

inline Vector<T, Size> reflect (const Vector<T, Size>& i, const Vector<T, Size>& n)
{
	return i - T(2) * dot(n, i) * n;
}